

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalIndexManager.hpp
# Opt level: O1

void __thiscall OpenMD::LocalIndexManager::LocalIndexManager(LocalIndexManager *this)

{
  IndexListContainer::IndexListContainer(&this->atomIndexContainer_,0,0x7fffffff);
  IndexListContainer::IndexListContainer(&this->rigidBodyIndexContainer_,0,0x7fffffff);
  IndexListContainer::IndexListContainer(&this->cutoffGroupIndexContainer_,0,0x7fffffff);
  IndexListContainer::IndexListContainer(&this->bondIndexContainer_,0,0x7fffffff);
  IndexListContainer::IndexListContainer(&this->bendIndexContainer_,0,0x7fffffff);
  IndexListContainer::IndexListContainer(&this->torsionIndexContainer_,0,0x7fffffff);
  IndexListContainer::IndexListContainer(&this->inversionIndexContainer_,0,0x7fffffff);
  return;
}

Assistant:

int getNextAtomIndex() { return atomIndexContainer_.pop(); }